

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O1

void __thiscall PageStack<FinalizableObject_*>::Release(PageStack<FinalizableObject_*> *this)

{
  Chunk *page;
  PagePool *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = IsEmpty(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x187,"(IsEmpty())","IsEmpty()");
    if (!bVar2) goto LAB_006fbe83;
    *puVar3 = 0;
  }
  if (this->currentChunk != (Chunk *)0x0) {
    if (this->currentChunk->nextChunk != (Chunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x18c,"(currentChunk->nextChunk == nullptr)",
                         "currentChunk->nextChunk == nullptr");
      if (!bVar2) {
LAB_006fbe83:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    page = this->currentChunk;
    this_00 = this->pagePool;
    this->pageCount = this->pageCount - 1;
    if ((page->super_PagePoolPage).isReserved == true) {
      Memory::PagePool::FreeReservedPage(this_00,&page->super_PagePoolPage);
    }
    else {
      page->nextChunk = (Chunk *)this_00->freePageList;
      this_00->freePageList = (PagePoolFreePage *)page;
    }
    this->currentChunk = (Chunk *)0x0;
  }
  this->nextEntry = (FinalizableObject **)0x0;
  this->chunkStart = (FinalizableObject **)0x0;
  this->chunkEnd = (FinalizableObject **)0x0;
  return;
}

Assistant:

void PageStack<T>::Release()
{
    Assert(IsEmpty());

    // We may have a preallocated chunk still held; if so release it.
    if (currentChunk != nullptr)
    {
        Assert(currentChunk->nextChunk == nullptr);
        FreeChunk(currentChunk);
        currentChunk = nullptr;
    }

    nextEntry = nullptr;
    chunkStart = nullptr;
    chunkEnd = nullptr;
}